

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::DataSourceDescriptor::Serialize(DataSourceDescriptor *this,Message *msg)

{
  bool bVar1;
  void *data;
  size_t size;
  Message *msg_local;
  DataSourceDescriptor *this_local;
  
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendString(msg,1,&this->name_);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,7);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,7,this->id_);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,2,(uint)(this->will_notify_on_stop_ & 1));
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,3,(uint)(this->will_notify_on_start_ & 1));
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,4,(uint)(this->handles_incremental_state_clear_ & 1));
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,5);
  if (bVar1) {
    protozero::Message::AppendString(msg,5,&this->gpu_counter_descriptor_);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,6);
  if (bVar1) {
    protozero::Message::AppendString(msg,6,&this->track_event_descriptor_);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,8);
  if (bVar1) {
    protozero::Message::AppendString(msg,8,&this->ftrace_descriptor_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void DataSourceDescriptor::Serialize(::protozero::Message* msg) const {
  // Field 1: name
  if (_has_field_[1]) {
    msg->AppendString(1, name_);
  }

  // Field 7: id
  if (_has_field_[7]) {
    msg->AppendVarInt(7, id_);
  }

  // Field 2: will_notify_on_stop
  if (_has_field_[2]) {
    msg->AppendTinyVarInt(2, will_notify_on_stop_);
  }

  // Field 3: will_notify_on_start
  if (_has_field_[3]) {
    msg->AppendTinyVarInt(3, will_notify_on_start_);
  }

  // Field 4: handles_incremental_state_clear
  if (_has_field_[4]) {
    msg->AppendTinyVarInt(4, handles_incremental_state_clear_);
  }

  // Field 5: gpu_counter_descriptor
  if (_has_field_[5]) {
    msg->AppendString(5, gpu_counter_descriptor_);
  }

  // Field 6: track_event_descriptor
  if (_has_field_[6]) {
    msg->AppendString(6, track_event_descriptor_);
  }

  // Field 8: ftrace_descriptor
  if (_has_field_[8]) {
    msg->AppendString(8, ftrace_descriptor_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}